

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

string * __thiscall
cppcms::widgets::base_text::value_abi_cxx11_(string *__return_storage_ptr__,base_text *this)

{
  cppcms_error *this_00;
  allocator local_39;
  string local_38;
  
  if (((&this->field_0x1f0)[(long)this->_vptr_base_text[-3]] & 2) != 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->value_);
    return __return_storage_ptr__;
  }
  this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"Value was not loaded",&local_39);
  cppcms_error::cppcms_error(this_00,&local_38);
  __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

std::string base_text::value()
{
	if(!set())
		throw cppcms_error("Value was not loaded");
	return value_;
}